

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  undefined1 local_48 [8];
  FilePath output_dir;
  FilePath output_file;
  FILE *xmlout;
  int param_2_local;
  UnitTest *unit_test_local;
  XmlUnitTestResultPrinter *this_local;
  
  output_file.pathname_.length_ = 0;
  FilePath::FilePath((FilePath *)&output_dir.pathname_.length_,&this->output_file_);
  FilePath::RemoveFileName((FilePath *)local_48);
  bVar1 = FilePath::CreateDirectoriesRecursively((FilePath *)local_48);
  if (bVar1) {
    pcVar2 = String::c_str(&this->output_file_);
    output_file.pathname_.length_ = (size_t)posix::FOpen(pcVar2,"w");
  }
  __stream = _stderr;
  if (output_file.pathname_.length_ != 0) {
    PrintXmlUnitTest((FILE *)output_file.pathname_.length_,unit_test);
    fclose((FILE *)output_file.pathname_.length_);
    FilePath::~FilePath((FilePath *)local_48);
    FilePath::~FilePath((FilePath *)&output_dir.pathname_.length_);
    return;
  }
  pcVar2 = String::c_str(&this->output_file_);
  fprintf(__stream,"Unable to open file \"%s\"\n",pcVar2);
  fflush(_stderr);
  exit(1);
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    xmlout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (xmlout == NULL) {
    // TODO(wan): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    fprintf(stderr,
            "Unable to open file \"%s\"\n",
            output_file_.c_str());
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
  PrintXmlUnitTest(xmlout, unit_test);
  fclose(xmlout);
}